

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int ftps_open_network(char *filename,curlmembuf *buffer)

{
  char *__src;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  float fVar10;
  float version;
  char tmphost [100];
  char agentStr [100];
  char url [1200];
  float local_5dc;
  curlmembuf *local_5d8;
  char *local_5d0;
  char local_5c8 [112];
  char local_558 [112];
  char local_4e8 [1208];
  
  local_5dc = 0.0;
  builtin_strncpy(local_4e8,"ftp://",7);
  sVar3 = strlen(filename);
  uVar1 = (uint)sVar3;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  else {
    uVar8 = 0;
    do {
      if (filename[uVar8] == '/') {
        uVar1 = (uint)uVar8;
        break;
      }
      uVar8 = uVar8 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar8);
    if (99 < uVar1) {
      pcVar9 = "Host name is too long in URL (ftps_open_network)";
      goto LAB_00135950;
    }
  }
  uVar8 = (ulong)uVar1;
  pcVar9 = local_5c8;
  local_5d8 = buffer;
  strncpy(pcVar9,filename,uVar8);
  local_5d0 = filename + uVar8;
  local_5c8[uVar8] = '\0';
  pcVar4 = strrchr(pcVar9,0x40);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "anonymous";
LAB_001358e4:
    fVar10 = ffvers(&local_5dc);
    pcVar5 = local_558;
    snprintf(pcVar5,100,"User-Agent: FITSIO/HEASARC/%-8.4f",(double)fVar10);
  }
  else {
    *pcVar4 = '\0';
    pcVar9 = pcVar4 + 1;
    pcVar4 = local_5c8;
    pcVar5 = strchr(pcVar4,0x3a);
    if (pcVar5 == (char *)0x0) {
      if (local_5c8[0] == '\0') {
        pcVar4 = "anonymous";
      }
      goto LAB_001358e4;
    }
    *pcVar5 = '\0';
    if (local_5c8[0] == '\0') {
      pcVar4 = "anonymous";
    }
    if (pcVar5[1] == '\0') goto LAB_001358e4;
    pcVar5 = pcVar5 + 1;
  }
  sVar3 = strlen(local_4e8);
  sVar6 = strlen(pcVar9);
  __src = local_5d0;
  sVar7 = strlen(local_5d0);
  if (sVar7 + sVar6 + sVar3 < 0x4ad) {
    strcat(local_4e8,pcVar9);
    strcat(local_4e8,__src);
    sVar3 = strlen(local_4e8);
    iVar2 = ssl_get_with_curl(local_4e8,local_5d8,pcVar4,pcVar5);
    sVar6 = strlen(local_4e8);
    if (((int)sVar6 - (int)sVar3 & 0xfffffffeU) != 2) {
      return iVar2;
    }
    sVar6 = strlen(filename);
    if (sVar6 < 0x3fe) {
      strcat(filename,local_4e8 + (int)sVar3);
      return iVar2;
    }
    pcVar9 = "Filename is too long to append compression ext (ftps_open_network)";
  }
  else {
    pcVar9 = "Full URL name is too long (ftps_open_network)";
  }
LAB_00135950:
  ffpmsg(pcVar9);
  return 0x68;
}

Assistant:

int ftps_open_network(char *filename, curlmembuf* buffer)
{
  char agentStr[SHORTLEN];
  char url[MAXLEN];
  char tmphost[SHORTLEN]; /* work array for separating user/pass/host names */
  char *username=0;
  char *password=0;
  char *hostname=0;
  char *dirpath=0;
  char *strptr=0;
  float version=0.0;
  int iDirpath=0, len=0, origLen=0;
  int status=0; 
  
  strcpy(url,"ftp://");

  /* The filename may already contain a username and password, as indicated 
     by a '@' within the host part of the name (which we'll define as the substring
     before the first '/').  If not, we'll set a default username:password  */
  len = strlen(filename);
  for (iDirpath=0; iDirpath<len; ++iDirpath)
  {
     if (filename[iDirpath] == '/')
        break;
  }
  if (iDirpath > SHORTLEN-1)
  {
     ffpmsg("Host name is too long in URL (ftps_open_network)");
     return (FILE_NOT_OPENED);
  }
  strncpy(tmphost, filename, iDirpath);
  dirpath = &filename[iDirpath];
  tmphost[iDirpath]='\0';
  
  /* There could be more than one '@' since they can also exist in the
     username or password.  Find the right-most '@' and assume that it
     delimits the host name. */
  hostname = strrchr(tmphost, '@');
  if (hostname)
  {
     *hostname = '\0';
     ++hostname;
     /* Assume first occurrence of ':' is indicative of password delimiter. */
     password = strchr(tmphost, ':');
     if (password)
     {
        *password = '\0';
        ++password;
     }
     username = tmphost;
  }
  else
     hostname = tmphost;
  
  if (!username || strlen(username)==0)
     username = "anonymous";
  if (!password || strlen(password)==0)
  {
     snprintf(agentStr,SHORTLEN,"User-Agent: FITSIO/HEASARC/%-8.4f",ffvers(&version));
     password = agentStr;
  }
  
  /* url may eventually have .gz or .Z appended to it */
  if (strlen(url) + strlen(hostname) + strlen(dirpath) > MAXLEN-4)
  {
     ffpmsg("Full URL name is too long (ftps_open_network)");
     return (FILE_NOT_OPENED);
  }
  strcat(url, hostname);
  strcat(url, dirpath);
  
/*  printf("url = %s\n",url);
  printf("username = %s\n",username);
  printf("password = %s\n",password);
  printf("hostname = %s\n",hostname);
*/

  origLen = strlen(url);
  status = ssl_get_with_curl(url, buffer, username, password);
  /* If original url has .gz or .Z appended, do the same to the original filename.
     Note that url also differs from original filename at this point, since
     filename may have included username@password (which url would not). */
  len = strlen(url);
  if ((len-origLen) == 2 || (len-origLen) == 3)
  {
     if (strlen(filename) > FLEN_FILENAME - 4)
     {
        ffpmsg("Filename is too long to append compression ext (ftps_open_network)");
        /* buffer memory must be freed by calling routine */
        return (FILE_NOT_OPENED);
     }
     strptr = url + origLen;
     strcat(filename, strptr);
  }
  return status;
  
 }